

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unwind.c
# Opt level: O1

LispPTR * N_OP_unwind(LispPTR *cstkptr,LispPTR tos,int n,int keep)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  
  pLVar5 = (LispPTR *)(MachineState.pvar + (long)n * 2);
  if (cstkptr < pLVar5) {
    MachineState.errorexit = 1;
    pLVar4 = (LispPTR *)0xffffffffffffffff;
    MachineState.csp = (DLword *)cstkptr;
    MachineState.tosvalue = tos;
  }
  else {
    *cstkptr = tos;
    for (pLVar4 = cstkptr + 1; pLVar5 < pLVar4; pLVar4 = pLVar4 + -1) {
      uVar1 = pLVar4[-1];
      if (((int)uVar1 < 0) && ((int)uVar1 >> 0x10 < -1)) {
        iVar2 = -((int)uVar1 >> 0x10);
        iVar3 = 2;
        if (iVar2 < 2) {
          iVar3 = iVar2;
        }
        memset(MachineState.pvar + (ulong)(uint)(iVar2 - iVar3) * -2 + (ulong)(uVar1 & 0xffff),0xff,
               (ulong)(uint)(iVar2 - iVar3) * 4 + 4);
      }
    }
    if (keep != 0) {
      *pLVar4 = tos;
      pLVar4 = pLVar4 + 1;
    }
  }
  return pLVar4;
}

Assistant:

LispPTR *N_OP_unwind(LispPTR *cstkptr, LispPTR tos, int n, int keep) {
  int num;           /* number of UNBOUND slot */
  LispPTR *endptr;   /* unwind limit */
  LispPTR *lastpvar; /* points PVar slot that is unbounded. */

  /* Slots:
          -----------------
          |		|	<- PVar
          -----------------
          |	.	|
          |	.	|
          -----------------
          |		|	 ALL OF THE FOLLOWING LOCATIONS SCANNED:
          -----------------------------------------------------------------
          | tos if keep	|	<- endptr (PVar[n]) <- Result (no keep)	|
          -----------------						|
          |		|	<- Result (keep)			|
          -----------------						|
          |		|						|
          -----------------						|
          |	.	|						|
          |	.	|						|
          -----------------						|
          |   tos pushed	|	<- Start CSTKPTR			|
          -----------------------------------------------------------------
          |		|	<- CSTKPTR temporarily bumped pushing tos
          -----------------

          NOTE: upon return the emulator does a POP to get the new tos value

  */

  endptr = (LispPTR *)PVar + n; /* set unwind limit */

  if (endptr > cstkptr) {
    CurrentStackPTR = (DLword *)cstkptr;
    /* this would be ERROR_EXIT(tos); but for having to return a pointer */
    TopOfStack = tos;
    Error_Exit = 1;
    return (LispPTR *)(-1);
  }
  *cstkptr++ = tos;

  /* UNBOUND MARK loop  */

  while (cstkptr > endptr) {
    /* Look for the Next BIND marker */

    if ((num = (int)*--cstkptr) < 0) {
      /* Now UNBIND the PVARS indicated by the BIND marker */

      lastpvar = (LispPTR *)(2 + PVar + (unsigned short)num);
      num = ~(num >> 16) + 1;
      for (; --num > 0;) { *--lastpvar = 0xffffffff; /* Mark as UNBOUND */ }
    }
  }

  /* endptr = cstkptr */

  if (keep) { *(cstkptr++) = tos; }
  return (cstkptr);

}